

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall
IMLE<1,_1,_FastLinearExpert>::IMLE(IMLE<1,_1,_FastLinearExpert> *this,Param *prm,int pre_alloc)

{
  Param::Param(&this->param);
  (this->experts).
  super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  .
  super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->experts).
  super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  .
  super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->experts).
  super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  .
  super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  memset(&this->zeta,0,0xc0);
  memset(&this->sNearestInv,0,200);
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)pre_alloc);
  reset(this,prm);
  return;
}

Assistant:

IMLE_base::IMLE(Param const &prm, int pre_alloc)
#endif
{
    init( pre_alloc );
    reset(prm);
}